

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBox2dShape.cpp
# Opt level: O3

void __thiscall
cbtBox2dShape::getAabb(cbtBox2dShape *this,cbtTransform *t,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  float fVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float in_XMM0_Da;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
  fVar3 = in_XMM0_Da +
          (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
          m_implicitShapeDimensions.m_floats[1];
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  fVar4 = in_XMM0_Da +
          (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
          m_implicitShapeDimensions.m_floats[0];
  in_XMM0_Da = in_XMM0_Da +
               (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
               m_implicitShapeDimensions.m_floats[2];
  fVar1 = (t->m_origin).m_floats[2];
  auVar9 = vinsertps_avx(*(undefined1 (*) [16])((t->m_basis).m_el[0].m_floats + 1),
                         ZEXT416((uint)(t->m_basis).m_el[1].m_floats[1]),0x10);
  auVar6 = vinsertps_avx(*(undefined1 (*) [16])(t->m_basis).m_el[0].m_floats,
                         ZEXT416((uint)(t->m_basis).m_el[1].m_floats[0]),0x10);
  auVar7 = vinsertps_avx(*(undefined1 (*) [16])((t->m_basis).m_el[0].m_floats + 2),
                         ZEXT416((uint)(t->m_basis).m_el[1].m_floats[2]),0x10);
  auVar10 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[2].m_floats[1]),auVar13);
  auVar8 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[2].m_floats[0]),auVar13);
  auVar5 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[2].m_floats[2]),auVar13);
  auVar9 = vandps_avx(auVar9,auVar13);
  auVar6 = vandps_avx(auVar6,auVar13);
  auVar7 = vandps_avx(auVar7,auVar13);
  auVar11._0_4_ = fVar3 * auVar9._0_4_;
  auVar11._4_4_ = fVar3 * auVar9._4_4_;
  auVar11._8_4_ = fVar3 * auVar9._8_4_;
  auVar11._12_4_ = fVar3 * auVar9._12_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar3)),ZEXT416((uint)fVar4),auVar8);
  auVar10._4_4_ = fVar4;
  auVar10._0_4_ = fVar4;
  auVar10._8_4_ = fVar4;
  auVar10._12_4_ = fVar4;
  uVar2 = *(ulong *)(t->m_origin).m_floats;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar2;
  auVar10 = vfmadd213ps_fma(auVar10,auVar6,auVar11);
  auVar5 = vfmadd231ss_fma(auVar8,ZEXT416((uint)in_XMM0_Da),auVar5);
  auVar8._4_4_ = in_XMM0_Da;
  auVar8._0_4_ = in_XMM0_Da;
  auVar8._8_4_ = in_XMM0_Da;
  auVar8._12_4_ = in_XMM0_Da;
  auVar8 = vfmadd213ps_fma(auVar8,auVar7,auVar10);
  auVar10 = vsubps_avx(auVar12,auVar8);
  auVar9._0_4_ = auVar8._0_4_ + (float)uVar2;
  auVar9._4_4_ = auVar8._4_4_ + (float)(uVar2 >> 0x20);
  auVar9._8_4_ = auVar8._8_4_ + 0.0;
  auVar9._12_4_ = auVar8._12_4_ + 0.0;
  auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)(fVar1 - auVar5._0_4_)),0x28);
  *(undefined1 (*) [16])aabbMin->m_floats = auVar10;
  auVar10 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar1 + auVar5._0_4_)),0x28);
  *(undefined1 (*) [16])aabbMax->m_floats = auVar10;
  return;
}

Assistant:

void cbtBox2dShape::getAabb(const cbtTransform& t, cbtVector3& aabbMin, cbtVector3& aabbMax) const
{
	cbtTransformAabb(getHalfExtentsWithoutMargin(), getMargin(), t, aabbMin, aabbMax);
}